

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_shift_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST *pAVar2;
  AST_Binary_Expression *local_28;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  local_28 = (AST_Binary_Expression *)parse_additive_expression(translation_data,scope);
  while( true ) {
    while( true ) {
      if (translation_data->tokens->size == 0) {
        return (AST *)local_28;
      }
      iVar1 = *translation_data->tokens->first->data;
      if (iVar1 != 0x3f) break;
      chomp(translation_data);
      pAVar2 = parse_additive_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_SHIFT_RIGHT);
    }
    if (iVar1 != 0x40) break;
    chomp(translation_data);
    pAVar2 = parse_additive_expression(translation_data,scope);
    local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_SHIFT_LEFT);
  }
  return (AST *)local_28;
}

Assistant:

struct AST* parse_shift_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_additive_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_SHIFT_LEFT:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_additive_expression(translation_data,scope),OP_SHIFT_LEFT);
				break;
			case KW_SHIFT_RIGHT:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_additive_expression(translation_data,scope),OP_SHIFT_RIGHT);
				break;
			default:
				return hold;
		}
	}
	return hold;
}